

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall Joytime::Controller::setVibration(Controller *this,bool vibrate)

{
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  allocator<unsigned_char> local_42;
  byte local_41;
  byte *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  bool vibrate_local;
  Controller *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = vibrate;
  performUsabilityCheck(this);
  local_41 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
  local_40 = &local_41;
  local_38 = 1;
  std::allocator<unsigned_char>::allocator(&local_42);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,__l,&local_42);
  std::allocator<unsigned_char>::~allocator(&local_42);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sendSubcommand(&local_70,this,RumbleAndSubcommand,SetVibration,&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void Joytime::Controller::setVibration(bool vibrate) {
  performUsabilityCheck();
  std::vector<uint8_t> buf = { (uint8_t)((vibrate) ? 1 : 0) };

  sendSubcommand(Joytime::ControllerCommand::RumbleAndSubcommand, Joytime::ControllerSubcommand::SetVibration, buf);
}